

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.cpp
# Opt level: O2

uzoff_t __thiscall IZDeflate::deflate_fast(IZDeflate *this)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uzoff_t uVar6;
  uint uVar7;
  uint uVar8;
  uch *puVar9;
  ulong uVar10;
  int iVar11;
  
  this->prev_length = 2;
  do {
    if (this->lookahead == 0) {
      uVar10 = this->block_start;
      puVar9 = (uch *)0x0;
      if (-1 < (long)uVar10) {
        puVar9 = this->window + (uVar10 & 0xffffffff);
      }
      uVar6 = flush_block(this,(char *)puVar9,this->strstart - uVar10,1);
      return uVar6;
    }
    uVar8 = this->strstart;
    uVar7 = (this->ins_h & 0x3ff) << 5 ^ (uint)this->window[uVar8 + 2];
    this->ins_h = uVar7;
    uVar2 = this->head[uVar7];
    this->prev[uVar8 & 0x7fff] = uVar2;
    this->head[uVar7] = (Pos)uVar8;
    if (uVar8 - uVar2 < 0x7efb && uVar2 != 0) {
      uVar4 = longest_match(this,(uint)uVar2);
      uVar8 = this->strstart;
      uVar7 = this->lookahead;
      if (uVar4 < this->lookahead) {
        uVar7 = uVar4;
      }
      if (uVar7 < 3) goto LAB_0012a366;
      iVar5 = ct_tally(this,uVar8 - this->match_start,uVar7 - 3);
      uVar8 = this->lookahead - uVar7;
      this->lookahead = uVar8;
      if (uVar7 <= this->max_lazy_match) {
        iVar11 = uVar7 - 1;
        uVar10 = (ulong)this->ins_h;
        uVar4 = this->strstart + 1;
        do {
          this->strstart = uVar4;
          uVar7 = ((uint)uVar10 & 0x3ff) << 5 ^ (uint)this->window[uVar4 + 2];
          uVar10 = (ulong)uVar7;
          this->ins_h = uVar7;
          this->prev[uVar4 & 0x7fff] = this->head[uVar10];
          this->head[uVar10] = (Pos)uVar4;
          uVar4 = uVar4 + 1;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        goto LAB_0012a390;
      }
      uVar3 = this->strstart;
      uVar4 = uVar3 + uVar7;
      this->strstart = uVar4;
      bVar1 = this->window[uVar4];
      this->ins_h = (uint)bVar1;
      this->ins_h = (uint)this->window[uVar3 + uVar7 + 1] ^ (uint)bVar1 << 5;
    }
    else {
LAB_0012a366:
      iVar5 = ct_tally(this,0,(uint)this->window[uVar8]);
      uVar8 = this->lookahead - 1;
      this->lookahead = uVar8;
      uVar4 = this->strstart + 1;
LAB_0012a390:
      this->strstart = uVar4;
    }
    if (iVar5 != 0) {
      uVar10 = this->block_start;
      puVar9 = this->window + (uVar10 & 0xffffffff);
      if ((long)uVar10 < 0) {
        puVar9 = (uch *)0x0;
      }
      flush_block(this,(char *)puVar9,uVar4 - uVar10,0);
      uVar8 = this->lookahead;
      this->block_start = (ulong)this->strstart;
    }
    if (uVar8 < 0x106) {
      fill_window(this);
    }
  } while( true );
}

Assistant:

uzoff_t IZDeflate::deflate_fast()
{
    IPos hash_head = NIL;      /* head of the hash chain */
    int flush;                 /* set if current block must be flushed */
    unsigned match_length = 0; /* length of best match */

    prev_length = MIN_MATCH - 1;
    while (lookahead != 0) {
        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
#    ifndef DEFL_UNDETERM
        if (lookahead >= MIN_MATCH)
#    endif
            INSERT_STRING(strstart, hash_head);

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && strstart - hash_head <= MAX_DIST) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
#    ifndef HUFFMAN_ONLY
#        ifndef DEFL_UNDETERM
            /* Do not look for matches beyond the end of the input.
             * This is necessary to make deflate deterministic.
             */
            if ((unsigned)nice_match > lookahead) nice_match = (int)lookahead;
#        endif
            match_length = longest_match(hash_head);
            /* longest_match() sets match_start */
            if (match_length > lookahead) match_length = lookahead;
#    endif
        }
        if (match_length >= MIN_MATCH) {
            check_match(strstart, match_start, match_length);

            flush = ct_tally(strstart - match_start, match_length - MIN_MATCH);

            lookahead -= match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
            if (match_length <= max_insert_length
#    ifndef DEFL_UNDETERM
                && lookahead >= MIN_MATCH
#    endif
            ) {
                match_length--; /* string at strstart already in hash table */
                do {
                    strstart++;
                    INSERT_STRING(strstart, hash_head);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
#    ifdef DEFL_UNDETERM
                    /* If lookahead < MIN_MATCH these bytes are garbage,
                     * but it does not matter since the next lookahead bytes
                     * will be emitted as literals.
                     */
#    endif
                } while (--match_length != 0);
                strstart++;
            } else {
                strstart += match_length;
                match_length = 0;
                ins_h = window[strstart];
                UPDATE_HASH(ins_h, window[strstart + 1]);
#    if MIN_MATCH != 3
                Call UPDATE_HASH() MIN_MATCH - 3 more times
#    endif
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr, "%c", window[strstart]));
            flush = ct_tally(0, window[strstart]);
            lookahead--;
            strstart++;
        }
        if (flush) FLUSH_BLOCK(0), block_start = strstart;

        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (lookahead < MIN_LOOKAHEAD) fill_window();
    }
    return FLUSH_BLOCK(1); /* eof */
}